

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

void __thiscall
slang::ast::BinaryExpression::serializeTo(BinaryExpression *this,ASTSerializer *serializer)

{
  size_t __n;
  
  __n = strlen(*(char **)(toString(slang::ast::BinaryOperator)::strings + (long)(int)this->op * 8));
  ASTSerializer::write(serializer,2,"op",__n);
  ASTSerializer::write(serializer,4,"left",(size_t)this->left_);
  ASTSerializer::write(serializer,5,"right",(size_t)this->right_);
  return;
}

Assistant:

void BinaryExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("op", toString(op));
    serializer.write("left", left());
    serializer.write("right", right());
}